

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O2

void __thiscall xemmai::t_lexer::f_read_indent(t_lexer *this)

{
  int iVar1;
  
  while( true ) {
    if (this->v_c == 10) {
      return;
    }
    iVar1 = iswspace(this->v_c);
    if (iVar1 == 0) break;
    t_stringer::operator<<(&this->v_indent,this->v_c);
    f_get(this);
  }
  return;
}

Assistant:

void f_read_indent()
	{
		while (v_c != L'\n' && std::iswspace(v_c)) {
			v_indent << v_c;
			f_get();
		}
	}